

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

void resolve_path(char *buf,size_t buflen,char *path)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  char cVar4;
  size_t sVar5;
  char *pcVar6;
  char cVar7;
  __array mypath;
  unique_ptr<char,_void_(*)(void_*)> rpath;
  _Head_base<0UL,_char_*,_false> local_48;
  unique_ptr<char,_void_(*)(void_*)> local_40;
  
  sVar5 = strlen((char *)buflen);
  pcVar6 = (char *)operator_new__(sVar5 + 1);
  local_48._M_head_impl = pcVar6;
  memcpy(pcVar6,(void *)buflen,sVar5 + 1);
  pcVar6 = pcVar6 + sVar5;
  cVar7 = '\0';
  do {
    local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
    _M_head_impl = realpath(local_48._M_head_impl,(char *)0x0);
    local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
    super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(void_*),_false>)free;
    *pcVar6 = cVar7;
    if (local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
        _M_head_impl == (char *)0x0) {
      do {
        pcVar1 = pcVar6;
        if (pcVar6 <= local_48._M_head_impl) break;
        pcVar2 = pcVar6 + -1;
        pcVar6 = pcVar6 + -1;
      } while (*pcVar2 != '/');
      do {
        pcVar6 = pcVar1;
        if (pcVar6 <= local_48._M_head_impl) break;
        pcVar1 = pcVar6 + -1;
      } while (pcVar6[-1] == '/');
      if (pcVar6 == local_48._M_head_impl) {
        safe_strcpy(buf,0x1000,local_48._M_head_impl);
        goto LAB_001e09e3;
      }
      cVar7 = *pcVar6;
      *pcVar6 = '\0';
      bVar3 = true;
    }
    else {
      cVar4 = cVar7;
      if (cVar7 == '\0') {
        safe_strcpy(buf,0x1000,
                    local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl);
        cVar7 = '\0';
      }
      else {
        while (cVar4 == '/') {
          pcVar1 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
          cVar4 = *pcVar1;
        }
        os_build_full_path(buf,0x1000,
                           local_40._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl,pcVar6);
      }
LAB_001e09e3:
      bVar3 = false;
    }
    std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_40);
    if (!bVar3) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_48);
      return;
    }
  } while( true );
}

Assistant:

static void
resolve_path( char *buf, size_t buflen, const char *path )
{
    // Starting with the full path string, try resolving the path with
    // realpath().  The tricky bit is that realpath() will fail if any
    // component of the path doesn't exist, but we need to resolve paths
    // for prospective filenames, such as files or directories we're
    // about to create.  So if realpath() fails, remove the last path
    // component and try again with the remainder.  Repeat until we
    // can resolve a real path, or run out of components to remove.
    // The point of this algorithm is that it will resolve as much of
    // the path as actually exists in the file system, ensuring that
    // we resolve any links that affect the path.  Any portion of the
    // path that doesn't exist obviously can't refer to a link, so it
    // will be taken literally.  Once we've resolved the longest prefix,
    // tack the stripped portion back on to form the fully resolved
    // path.

    // make a writable copy of the path to work with
    size_t pathl = strlen(path);
    const auto mypath = std::make_unique<char[]>(pathl + 1);
    memcpy(mypath.get(), path, pathl + 1);

    // start at the very end of the path, with no stripped suffix yet
    char *suffix = mypath.get() + pathl;
    char sl = '\0';

    // keep going until we resolve something or run out of path
    for (;;)
    {
        // resolve the current prefix, allocating the result
        const std::unique_ptr<char, decltype(&free)>
                rpath(realpath(mypath.get(), 0), &free);

        // un-split the path
        *suffix = sl;

        // if we resolved the prefix, return the result
        if (rpath)
        {
            // success - if we separated a suffix, reattach it
            if (*suffix != '\0')
            {
                // reattach the suffix (the part after the '/')
                for ( ; *suffix == '/' ; ++suffix) ;
                os_build_full_path(buf, buflen, rpath.get(), suffix);
            }
            else
            {
                // no suffix, so we resolved the entire path
                safe_strcpy(buf, buflen, rpath.get());
            }

            // done searching
            break;
        }

        // no luck with realpath(); search for the '/' at the end of the
        // previous component in the path 
        for ( ; suffix > mypath.get() && *(suffix-1) != '/' ; --suffix) ;

        // skip any redundant slashes
        for ( ; suffix > mypath.get() && *(suffix-1) == '/' ; --suffix) ;

        // if we're at the root element, we're out of path elements
        if (suffix == mypath.get())
        {
            // we can't resolve any part of the path, so just return the
            // original path unchanged
            safe_strcpy(buf, buflen, mypath.get());
            break;
        }

        // split the path here into prefix and suffix, and try again
        sl = *suffix;
        *suffix = '\0';
    }
}